

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::encodeNumber<float>(JsonGenerator *this,float t)

{
  ostringstream oss;
  uint8_t *local_1a8;
  size_t local_1a0;
  ostringstream local_188 [376];
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,t);
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,local_1a8,local_1a0);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void encodeNumber(T t) {
        sep();
        std::ostringstream oss;
        oss << t;
        const std::string& s = oss.str();
        out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
        sep2();
    }